

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

ProValueMap * __thiscall
QMakeEvaluator::findValues(QMakeEvaluator *this,ProKey *variableName,Iterator *rit)

{
  _List_node_base *this_00;
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)&this->m_valuemapStack;
  bVar1 = true;
  while( true ) {
    bVar2 = bVar1;
    p_Var5 = p_Var5->_M_prev;
    this_00 = p_Var5 + 1;
    iVar3 = QMap<ProKey,_ProStringList>::find((QMap<ProKey,_ProStringList> *)this_00,variableName);
    iVar4._M_node =
         (_Base_ptr)QMap<ProKey,_ProStringList>::end((QMap<ProKey,_ProStringList> *)this_00);
    if (iVar3.i._M_node != (iterator)iVar4._M_node) {
      if (*(long *)((long)iVar3.i._M_node + 0x58) == QMakeInternal::statics._608_8_) {
        return (ProValueMap *)(_List_node_base *)0x0;
      }
      (rit->i)._M_node = (_Base_ptr)iVar3.i._M_node;
      return (ProValueMap *)this_00;
    }
    if (p_Var5 == (this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next) break;
    bVar1 = false;
    if (bVar2) {
      bVar2 = isFunctParam(variableName);
      bVar1 = false;
      if (bVar2) {
        return (ProValueMap *)(_List_node_base *)0x0;
      }
    }
  }
  return (ProValueMap *)(_List_node_base *)0x0;
}

Assistant:

ProValueMap *QMakeEvaluator::findValues(const ProKey &variableName, ProValueMap::Iterator *rit)
{
    ProValueMapStack::iterator vmi = m_valuemapStack.end();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::Iterator it = (*vmi).find(variableName);
        if (it != (*vmi).end()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            *rit = it;
            return &(*vmi);
        }
        if (vmi == m_valuemapStack.begin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return nullptr;
}